

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O0

bool __thiscall
llvm::cl::opt<unsigned_int,_false,_llvm::cl::parser<unsigned_int>_>::handleOccurrence
          (opt<unsigned_int,_false,_llvm::cl::parser<unsigned_int>_> *this,uint pos,
          StringRef ArgName,StringRef Arg)

{
  bool bVar1;
  uint local_40;
  uint local_3c;
  parser_data_type_conflict1 Val;
  uint pos_local;
  opt<unsigned_int,_false,_llvm::cl::parser<unsigned_int>_> *this_local;
  StringRef Arg_local;
  StringRef ArgName_local;
  
  Arg_local.Length = (size_t)ArgName.Data;
  Arg_local.Data = (char *)Arg.Length;
  this_local = (opt<unsigned_int,_false,_llvm::cl::parser<unsigned_int>_> *)Arg.Data;
  local_40 = 0;
  local_3c = pos;
  _Val = this;
  bVar1 = parser<unsigned_int>::parse(&this->Parser,&this->super_Option,ArgName,Arg,&local_40);
  if (!bVar1) {
    opt_storage<unsigned_int,_false,_false>::setValue<unsigned_int>
              (&this->super_opt_storage<unsigned_int,_false,_false>,&local_40,false);
    Option::setPosition(&this->super_Option,local_3c);
  }
  return bVar1;
}

Assistant:

bool handleOccurrence(unsigned pos, StringRef ArgName,
                        StringRef Arg) override {
    typename ParserClass::parser_data_type Val =
        typename ParserClass::parser_data_type();
    if (Parser.parse(*this, ArgName, Arg, Val))
      return true; // Parse error!
    this->setValue(Val);
    this->setPosition(pos);
    return false;
  }